

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

SentencePieceText_SentencePiece *
google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SentencePieceText_SentencePiece>
          (Arena *arena)

{
  Arena *arena_local;
  SentencePieceText_SentencePiece *local_40;
  Arena *local_38;
  Arena *local_30;
  size_t local_28;
  size_t n;
  Arena *local_18;
  void *local_10;
  
  if (arena == (Arena *)0x0) {
    local_40 = (SentencePieceText_SentencePiece *)operator_new(0x50);
    sentencepiece::SentencePieceText_SentencePiece::SentencePieceText_SentencePiece(local_40);
  }
  else {
    n._7_1_ = 1;
    local_30 = arena;
    local_18 = arena;
    local_28 = internal::AlignUpTo8(0x50);
    internal::ArenaImpl::RecordAlloc
              ((ArenaImpl *)arena,
               (type_info *)&sentencepiece::SentencePieceText_SentencePiece::typeinfo,local_28);
    if ((n._7_1_ & 1) == 0) {
      local_10 = internal::ArenaImpl::AllocateAlignedAndAddCleanup
                           ((ArenaImpl *)arena,local_28,
                            internal::
                            arena_destruct_object<sentencepiece::SentencePieceText_SentencePiece>);
    }
    else {
      local_10 = AllocateAlignedTo<8ul>(arena,0x50);
    }
    local_38 = arena;
    local_40 = InternalHelper<sentencepiece::SentencePieceText_SentencePiece>::
               Construct<google::protobuf::Arena*>(local_10,&local_38);
  }
  return local_40;
}

Assistant:

PROTOBUF_NAMESPACE_OPEN
template<> PROTOBUF_NOINLINE ::sentencepiece::SentencePieceText_SentencePiece* Arena::CreateMaybeMessage< ::sentencepiece::SentencePieceText_SentencePiece >(Arena* arena) {
  return Arena::CreateMessageInternal< ::sentencepiece::SentencePieceText_SentencePiece >(arena);
}